

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

void lj_meta_call(lua_State *L,TValue *func,TValue *top)

{
  cTValue *pcVar1;
  TValue *local_c0;
  TValue *p;
  cTValue *mo;
  TValue *top_local;
  TValue *func_local;
  lua_State *L_local;
  
  pcVar1 = lj_meta_lookup(L,func,MM_call);
  local_c0 = top;
  if ((int)(pcVar1->field_4).it >> 0xf == -9) {
    for (; func + 2 < local_c0; local_c0 = local_c0 + -1) {
      *local_c0 = local_c0[-1];
    }
    func[2] = *func;
    func->field_4 = (anon_struct_8_2_7fa0a05d_for_TValue_4)*pcVar1;
    return;
  }
  lj_err_optype_call(L,func);
}

Assistant:

void lj_meta_call(lua_State *L, TValue *func, TValue *top)
{
  cTValue *mo = lj_meta_lookup(L, func, MM_call);
  TValue *p;
  if (!tvisfunc(mo))
    lj_err_optype_call(L, func);
  for (p = top; p > func+2*LJ_FR2; p--) copyTV(L, p, p-1);
  if (LJ_FR2) copyTV(L, func+2, func);
  copyTV(L, func, mo);
}